

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O1

int secp256k1_borromean_sign
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *e0,secp256k1_scalar *s,secp256k1_gej *pubs,secp256k1_scalar *k,
              secp256k1_scalar *sec,size_t *rsizes,size_t *secidx,size_t nrings,uchar *m,size_t mlen
              )

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  secp256k1_gej *psVar4;
  secp256k1_gej *a;
  secp256k1_scalar *ng;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  size_t size;
  secp256k1_scalar ens;
  uchar tmp [33];
  secp256k1_gej rgej;
  secp256k1_ge rge;
  secp256k1_strauss_point_state ps [1];
  uint32_t ring;
  uint32_t epos;
  secp256k1_fe zr [8];
  int local_e7c;
  secp256k1_ecmult_gen_context *local_e78;
  long local_e70;
  secp256k1_gej *local_e68;
  secp256k1_gej *local_e60;
  size_t local_e58;
  size_t local_e50;
  undefined1 local_e48 [16];
  undefined1 local_e38 [16];
  uchar *local_e20;
  secp256k1_scalar *local_e18;
  secp256k1_gej *local_e10;
  secp256k1_scalar *local_e08;
  secp256k1_ecmult_context *local_e00;
  secp256k1_strauss_state local_df8;
  secp256k1_gej *local_dd8;
  secp256k1_scalar *local_dd0;
  uchar local_dc8 [48];
  secp256k1_gej local_d98;
  secp256k1_ge local_d18;
  secp256k1_sha256 local_cb8;
  secp256k1_strauss_point_state local_c48;
  secp256k1_gej local_838 [8];
  secp256k1_ge local_438 [8];
  secp256k1_fe local_178 [8];
  
  local_cb8.s[0] = 0x6a09e667;
  local_cb8.s[1] = 0xbb67ae85;
  local_cb8.s[2] = 0x3c6ef372;
  local_cb8.s[3] = 0xa54ff53a;
  local_cb8.s[4] = 0x510e527f;
  local_cb8.s[5] = 0x9b05688c;
  local_cb8.s[6] = 0x1f83d9ab;
  local_cb8.s[7] = 0x5be0cd19;
  local_cb8.bytes = 0;
  local_e78 = ecmult_gen_ctx;
  local_e20 = e0;
  local_e18 = s;
  local_e10 = pubs;
  local_e08 = k;
  local_e00 = ecmult_ctx;
  if (nrings != 0) {
    local_dd0 = s + 1;
    local_dd8 = pubs + 1;
    local_e70 = 0;
    psVar4 = (secp256k1_gej *)0x0;
    do {
      secp256k1_ecmult_gen(local_e78,&local_d98,local_e08 + (long)psVar4);
      secp256k1_ge_set_gej(&local_d18,&local_d98);
      if (local_d98.infinity != 0) {
        return 0;
      }
      secp256k1_eckey_pubkey_serialize(&local_d18,local_dc8,&local_e50,1);
      uVar6 = secidx[(long)psVar4] + 1;
      local_e68 = psVar4;
      if (uVar6 < rsizes[(long)psVar4]) {
        uVar2 = (uint)psVar4;
        local_e58 = CONCAT44(local_e58._4_4_,
                             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
        lVar5 = secidx[(long)psVar4] + local_e70;
        ng = local_dd0 + lVar5;
        psVar4 = local_dd8 + lVar5;
        do {
          local_c48.wnaf_na[0] = 0x6a09e667;
          local_c48.wnaf_na[1] = -0x4498517b;
          local_c48.wnaf_na[2] = 0x3c6ef372;
          local_c48.wnaf_na[3] = -0x5ab00ac6;
          local_c48.wnaf_na[4] = 0x510e527f;
          local_c48.wnaf_na[5] = -0x64fa9774;
          local_c48.wnaf_na[6] = 0x1f83d9ab;
          local_c48.wnaf_na[7] = 0x5be0cd19;
          local_c48.wnaf_na[0x18] = 0;
          local_c48.wnaf_na[0x19] = 0;
          local_838[0].x.n[0]._0_4_ = (undefined4)local_e58;
          uVar2 = (uint)uVar6;
          local_438[0].x.n[0]._0_4_ =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          local_e60 = psVar4;
          secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,local_dc8,0x21);
          secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,m,mlen);
          secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_838,4);
          secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_438,4);
          secp256k1_sha256_finalize((secp256k1_sha256 *)&local_c48,local_dc8);
          secp256k1_scalar_set_b32((secp256k1_scalar *)local_e48,local_dc8,&local_e7c);
          if (local_e7c != 0) {
            return 0;
          }
          if (SUB168(local_e38 | local_e48,8) == 0 && SUB168(local_e38 | local_e48,0) == 0) {
            return 0;
          }
          local_df8.prej = local_838;
          local_df8.zr = local_178;
          local_df8.pre_a = local_438;
          local_df8.ps = &local_c48;
          secp256k1_ecmult_strauss_wnaf
                    (local_e00,&local_df8,&local_d98,1,local_e60,(secp256k1_scalar *)local_e48,ng);
          if (local_d98.infinity != 0) {
            return 0;
          }
          secp256k1_ge_set_gej_var(&local_d18,&local_d98);
          psVar4 = local_e60;
          secp256k1_eckey_pubkey_serialize(&local_d18,local_dc8,&local_e50,1);
          uVar6 = uVar6 + 1;
          ng = ng + 1;
          psVar4 = psVar4 + 1;
        } while (uVar6 < rsizes[(long)local_e68]);
      }
      secp256k1_sha256_write(&local_cb8,local_dc8,local_e50);
      local_e70 = local_e70 + rsizes[(long)local_e68];
      psVar4 = (secp256k1_gej *)((long)(local_e68->x).n + 1);
    } while (psVar4 != (secp256k1_gej *)nrings);
  }
  secp256k1_sha256_write(&local_cb8,m,mlen);
  secp256k1_sha256_finalize(&local_cb8,local_e20);
  if (nrings != 0) {
    local_e78 = (secp256k1_ecmult_gen_context *)0x0;
    local_e58 = 0;
    do {
      local_c48.wnaf_na[0] = 0x6a09e667;
      local_c48.wnaf_na[1] = -0x4498517b;
      local_c48.wnaf_na[2] = 0x3c6ef372;
      local_c48.wnaf_na[3] = -0x5ab00ac6;
      local_c48.wnaf_na[4] = 0x510e527f;
      local_c48.wnaf_na[5] = -0x64fa9774;
      local_c48.wnaf_na[6] = 0x1f83d9ab;
      local_c48.wnaf_na[7] = 0x5be0cd19;
      local_c48.wnaf_na[0x18] = 0;
      local_c48.wnaf_na[0x19] = 0;
      uVar2 = (uint)local_e58;
      local_838[0].x.n[0]._0_4_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      local_e70 = CONCAT44(local_e70._4_4_,(uint)local_838[0].x.n[0]);
      local_438[0].x.n[0]._0_4_ = 0;
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,local_e20,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,m,mlen);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_838,4);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_438,4);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&local_c48,local_dc8);
      secp256k1_scalar_set_b32((secp256k1_scalar *)local_e48,local_dc8,&local_e7c);
      if (local_e7c != 0) {
        return 0;
      }
      if ((local_e38._8_8_ == 0 && local_e48._8_8_ == 0) &&
          (local_e38._0_8_ == 0 && local_e48._0_8_ == 0)) {
        return 0;
      }
      psVar4 = (secp256k1_gej *)(local_e18 + (long)local_e78);
      a = local_e10 + (long)local_e78;
      uVar6 = 0;
      while (sVar1 = local_e58, uVar6 < secidx[local_e58]) {
        local_df8.zr = local_178;
        local_e68 = a;
        local_e60 = psVar4;
        local_df8.prej = local_838;
        local_df8.pre_a = local_438;
        local_df8.ps = &local_c48;
        secp256k1_ecmult_strauss_wnaf
                  (local_e00,&local_df8,&local_d98,1,a,(secp256k1_scalar *)local_e48,
                   (secp256k1_scalar *)psVar4);
        if (local_d98.infinity != 0) {
          return 0;
        }
        secp256k1_ge_set_gej_var(&local_d18,&local_d98);
        secp256k1_eckey_pubkey_serialize(&local_d18,local_dc8,&local_e50,1);
        uVar6 = uVar6 + 1;
        local_c48.wnaf_na[0] = 0x6a09e667;
        local_c48.wnaf_na[1] = -0x4498517b;
        local_c48.wnaf_na[2] = 0x3c6ef372;
        local_c48.wnaf_na[3] = -0x5ab00ac6;
        local_c48.wnaf_na[4] = 0x510e527f;
        local_c48.wnaf_na[5] = -0x64fa9774;
        local_c48.wnaf_na[6] = 0x1f83d9ab;
        local_c48.wnaf_na[7] = 0x5be0cd19;
        local_c48.wnaf_na[0x18] = 0;
        local_c48.wnaf_na[0x19] = 0;
        local_838[0].x.n[0]._0_4_ = (uint)local_e70;
        uVar2 = (uint)uVar6;
        local_438[0].x.n[0]._0_4_ =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,local_dc8,0x21);
        secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,m,mlen);
        secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_838,4);
        secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_438,4);
        secp256k1_sha256_finalize((secp256k1_sha256 *)&local_c48,local_dc8);
        secp256k1_scalar_set_b32((secp256k1_scalar *)local_e48,local_dc8,&local_e7c);
        if (local_e7c != 0) {
          return 0;
        }
        psVar4 = (secp256k1_gej *)((local_e60->x).n + 4);
        a = local_e68 + 1;
        if ((local_e38._8_8_ == 0 && local_e48._8_8_ == 0) &&
            (local_e38._0_8_ == 0 && local_e48._0_8_ == 0)) {
          return 0;
        }
      }
      secp256k1_scalar_mul((secp256k1_scalar *)psVar4,(secp256k1_scalar *)local_e48,sec + local_e58)
      ;
      secp256k1_scalar_negate((secp256k1_scalar *)psVar4,(secp256k1_scalar *)psVar4);
      iVar3 = secp256k1_scalar_add
                        ((secp256k1_scalar *)psVar4,(secp256k1_scalar *)psVar4,local_e08 + sVar1);
      auVar7._0_4_ = -(uint)((int)(psVar4->x).n[2] == 0 && (int)(psVar4->x).n[0] == 0);
      auVar7._4_4_ = -(uint)(*(int *)((long)(psVar4->x).n + 0x14) == 0 &&
                            *(int *)((long)(psVar4->x).n + 4) == 0);
      auVar7._8_4_ = -(uint)((int)(psVar4->x).n[3] == 0 && (int)(psVar4->x).n[1] == 0);
      auVar7._12_4_ =
           -(uint)(*(int *)((long)(psVar4->x).n + 0x1c) == 0 &&
                  *(int *)((long)(psVar4->x).n + 0xc) == 0);
      iVar3 = movmskps(iVar3,auVar7);
      if (iVar3 == 0xf) {
        return 0;
      }
      local_e78 = (secp256k1_ecmult_gen_context *)((long)local_e78 + rsizes[sVar1]);
      local_e58 = sVar1 + 1;
    } while (local_e58 != nrings);
  }
  return 1;
}

Assistant:

int secp256k1_borromean_sign(const secp256k1_ecmult_context* ecmult_ctx, const secp256k1_ecmult_gen_context *ecmult_gen_ctx,
 unsigned char *e0, secp256k1_scalar *s, const secp256k1_gej *pubs, const secp256k1_scalar *k, const secp256k1_scalar *sec,
 const size_t *rsizes, const size_t *secidx, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(ecmult_gen_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(k != NULL);
    VERIFY_CHECK(sec != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(secidx != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    secp256k1_sha256_initialize(&sha256_e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_ecmult_gen(ecmult_gen_ctx, &rgej, &k[i]);
        secp256k1_ge_set_gej(&rge, &rgej);
        if (secp256k1_gej_is_infinity(&rgej)) {
            return 0;
        }
        secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        for (j = secidx[i] + 1; j < rsizes[i]; j++) {
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
            /** The signing algorithm as a whole is not memory uniform so there is likely a cache sidechannel that
             *  leaks which members are non-forgeries. That the forgeries themselves are variable time may leave
             *  an additional privacy impacting timing side-channel, but not a key loss one.
             */
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        }
        secp256k1_sha256_write(&sha256_e0, tmp, size);
        count += rsizes[i];
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ens)) {
            return 0;
        }
        for (j = 0; j < secidx[i]; j++) {
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
        }
        secp256k1_scalar_mul(&s[count + j], &ens, &sec[i]);
        secp256k1_scalar_negate(&s[count + j], &s[count + j]);
        secp256k1_scalar_add(&s[count + j], &s[count + j], &k[i]);
        if (secp256k1_scalar_is_zero(&s[count + j])) {
            return 0;
        }
        count += rsizes[i];
    }
    secp256k1_scalar_clear(&ens);
    secp256k1_ge_clear(&rge);
    secp256k1_gej_clear(&rgej);
    memset(tmp, 0, 33);
    return 1;
}